

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void * __thiscall
google::protobuf::Reflection::RepeatedFieldData
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpp_type,
          Descriptor *message_type)

{
  byte bVar1;
  uint32_t uVar2;
  Descriptor *v2;
  char *pcVar3;
  Nonnull<const_char_*> pcVar4;
  bool v1;
  string_view str;
  string_view str_00;
  string_view str_01;
  LogMessage local_50 [2];
  
  bVar1 = field->field_0x1;
  v1 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == v1) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (v1,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 0x20) == 0) {
      RepeatedFieldData();
LAB_001fa6f7:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xd58,
                 "field->cpp_type() == cpp_type || (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM && cpp_type == FieldDescriptor::CPPTYPE_INT32)"
                );
      str._M_str = "The type parameter T in RepeatedFieldRef<T> API doesn\'t match ";
      str._M_len = 0x3e;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(local_50,str)
      ;
      str_00._M_str = "the actual field type (for enums T should be the generated enum ";
      str_00._M_len = 0x40;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (local_50,str_00);
      str_01._M_str = "type or int32_t).";
      str_01._M_len = 0x11;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (local_50,str_01);
      if ((char)cpp_type != '\0') goto LAB_001fa793;
    }
    else {
      if (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == cpp_type) {
        cpp_type = 0;
      }
      else {
        cpp_type = (CppType)(cpp_type != CPPTYPE_INT32 ||
                            *(CppType *)
                             (FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) !=
                            CPPTYPE_ENUM);
      }
      if ((char)cpp_type != '\0') goto LAB_001fa6f7;
    }
    if (message_type == (Descriptor *)0x0) {
LAB_001fa687:
      if ((field->field_0x1 & 8) == 0) {
        pcVar3 = GetRawNonOneof<char>(this,message,field);
      }
      else {
        uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        pcVar3 = (char *)internal::ExtensionSet::GetRawRepeatedField
                                   ((ExtensionSet *)
                                    ((long)&(message->super_MessageLite)._vptr_MessageLite +
                                    (ulong)uVar2),field->number_,internal::kZeroBuffer);
      }
      return pcVar3;
    }
    v2 = FieldDescriptor::message_type(field);
    if (v2 == message_type) {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                         (message_type,v2,"message_type == field->message_type()");
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) goto LAB_001fa687;
  }
  else {
    RepeatedFieldData();
  }
  RepeatedFieldData();
LAB_001fa793:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_50);
}

Assistant:

const void* Reflection::RepeatedFieldData(
    const Message& message, const FieldDescriptor* field,
    FieldDescriptor::CppType cpp_type, const Descriptor* message_type) const {
  ABSL_CHECK(field->is_repeated());
  ABSL_CHECK(field->cpp_type() == cpp_type ||
             (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
              cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32_t).";
  if (message_type != nullptr) {
    ABSL_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRawRepeatedField(
        field->number(), internal::DefaultRawPtr());
  } else {
    return &GetRawNonOneof<char>(message, field);
  }
}